

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

char * __thiscall
llvm::ItaniumPartialDemangler::getFunctionDeclContextName
          (ItaniumPartialDemangler *this,char *Buf,size_t *N)

{
  byte bVar1;
  void *pvVar2;
  LocalName *LN;
  long lVar3;
  long *plVar4;
  size_t sVar5;
  OutputStream S;
  OutputStream local_40;
  
  pvVar2 = this->RootNode;
  if (pvVar2 == (void *)0x0) {
    __assert_fail("RootNode != nullptr && \"must call partialDemangle()\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                  ,0x145a,"bool llvm::ItaniumPartialDemangler::isFunction() const");
  }
  if (*(char *)((long)pvVar2 + 8) != '\x12') {
    return (char *)0x0;
  }
  lVar3 = *(long *)((long)pvVar2 + 0x18);
  local_40.CurrentPackIndex = 0xffffffff;
  local_40.CurrentPackMax = 0xffffffff;
  if (Buf == (char *)0x0) {
    sVar5 = 0x80;
    Buf = (char *)malloc(0x80);
    if (Buf == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    sVar5 = *N;
  }
  local_40.CurrentPosition = 0;
  local_40.Buffer = Buf;
  local_40.BufferCapacity = sVar5;
  do {
    bVar1 = *(byte *)(lVar3 + 8);
    if (bVar1 < 0x18) {
      if (bVar1 != 8) {
        if (bVar1 == 0x17) {
          plVar4 = *(long **)(lVar3 + 0x10);
          (**(code **)(*plVar4 + 0x20))(plVar4,&local_40);
          if (*(char *)((long)plVar4 + 9) != '\x01') {
            (**(code **)(*plVar4 + 0x28))(plVar4,&local_40);
          }
        }
        goto LAB_001b0110;
      }
LAB_001b0055:
      plVar4 = (long *)(lVar3 + 0x10);
    }
    else {
      if (bVar1 != 0x18) {
        if (bVar1 == 0x1f) goto LAB_001b0055;
        if (bVar1 == 0x21) {
          OutputStream::grow(&local_40,3);
          local_40.Buffer[local_40.CurrentPosition + 2] = 'd';
          (local_40.Buffer + local_40.CurrentPosition)[0] = 's';
          (local_40.Buffer + local_40.CurrentPosition)[1] = 't';
          local_40.CurrentPosition = local_40.CurrentPosition + 3;
        }
LAB_001b0110:
        OutputStream::grow(&local_40,1);
        local_40.Buffer[local_40.CurrentPosition] = '\0';
        if (N != (size_t *)0x0) {
          *N = local_40.CurrentPosition + 1;
          return local_40.Buffer;
        }
        return local_40.Buffer;
      }
      plVar4 = *(long **)(lVar3 + 0x10);
      (**(code **)(*plVar4 + 0x20))(plVar4,&local_40);
      if (*(char *)((long)plVar4 + 9) != '\x01') {
        (**(code **)(*plVar4 + 0x28))(plVar4,&local_40);
      }
      OutputStream::grow(&local_40,2);
      (local_40.Buffer + local_40.CurrentPosition)[0] = ':';
      (local_40.Buffer + local_40.CurrentPosition)[1] = ':';
      local_40.CurrentPosition = local_40.CurrentPosition + 2;
      plVar4 = (long *)(lVar3 + 0x18);
    }
    lVar3 = *plVar4;
  } while( true );
}

Assistant:

bool ItaniumPartialDemangler::isFunction() const {
  assert(RootNode != nullptr && "must call partialDemangle()");
  return static_cast<Node *>(RootNode)->getKind() == Node::KFunctionEncoding;
}